

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O3

void __thiscall xray_re::xr_mesh_builder::create_edges(xr_mesh_builder *this,bool calc_smoothness)

{
  b_edge_vec *this_00;
  pointer *ppbVar1;
  undefined2 uVar2;
  uint uVar3;
  pointer pbVar4;
  pointer puVar5;
  iterator __position;
  bool bVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint32_t uVar9;
  ulong v1;
  ulong v0;
  long lVar10;
  long lVar11;
  pointer this_01;
  b_edge local_48;
  pointer local_38;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->m_vertex_edges,
             ((long)(this->super_xr_mesh).m_points.
                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_xr_mesh).m_points.
                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,&BAD_IDX);
  this_00 = &this->m_edges;
  pbVar4 = (this->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_edges).
      super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    (this->m_edges).
    super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  }
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  reserve(this_00,((long)(this->super_xr_mesh).m_points.
                         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_xr_mesh).m_points.
                         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  this_01 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_faces).
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 == local_38) {
    return;
  }
  uVar9 = 0;
LAB_00174826:
  v1 = (ulong)(this_01->field_0).field_0.v[0];
  lVar10 = 3;
LAB_00174830:
  uVar3 = *(uint *)((long)this_01 + lVar10 * 4 + -4);
  v0 = (ulong)uVar3;
  lVar11 = lVar10 + -1;
  puVar5 = (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8 = puVar5 + v0;
  pbVar4 = (this_00->
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar7 = (ulong)*puVar8;
    if (uVar7 == 0xffffffff) {
      puVar8 = puVar5 + v1;
      goto LAB_0017486a;
    }
    puVar8 = &pbVar4[uVar7].link;
  } while (v1 != pbVar4[uVar7].v1);
  goto LAB_00174885;
  while (puVar8 = &pbVar4[uVar7].link, pbVar4[uVar7].v1 != uVar3) {
LAB_0017486a:
    uVar7 = (ulong)*puVar8;
    if (uVar7 == 0xffffffff) {
      *(undefined4 *)((long)&this_01->field_0 + lVar10 * 4 + 0x20) = 0xffffffff;
      __position._M_current =
           (this->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      puVar5 = (this->m_vertex_edges).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_48.link = puVar5[v0];
      puVar5[v0] = (uint)((ulong)((long)__position._M_current -
                                 (long)(this->m_edges).
                                       super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_48.v1 = (uint32_t)v1;
      local_48.size = 1;
      local_48.smooth = false;
      local_48.border = false;
      local_48.face0 = uVar9;
      if (__position._M_current ==
          (this->m_edges).
          super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
        ::_M_realloc_insert<xray_re::xr_mesh_builder::b_edge>(this_00,__position,&local_48);
      }
      else {
        (__position._M_current)->v1 = local_48.v1;
        (__position._M_current)->face0 = uVar9;
        (__position._M_current)->link = local_48.link;
        (__position._M_current)->size = (short)1;
        (__position._M_current)->smooth = (bool)(char)(1 >> 0x10);
        (__position._M_current)->border = (bool)(char)(1 >> 0x18);
        ppbVar1 = &(this->m_edges).
                   super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      goto LAB_0017493d;
    }
  }
LAB_00174885:
  uVar3 = pbVar4[uVar7].face0;
  *(uint *)((long)&this_01->field_0 + lVar10 * 4 + 0x20) = uVar3;
  uVar2 = pbVar4[uVar7].size;
  pbVar4[uVar7].size = uVar2 + 1;
  if (calc_smoothness) {
    if ((uint16_t)(uVar2 + 1) == 2) {
      bVar6 = b_face::is_edge_smooth
                        (this_01,(this->m_faces).
                                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar3,v0,v1);
    }
    else {
      bVar6 = false;
    }
    pbVar4[uVar7].smooth = bVar6;
  }
  pbVar4[uVar7].face0 = uVar9;
LAB_0017493d:
  v1 = v0;
  lVar10 = lVar11;
  if (lVar11 == 0) goto LAB_00174968;
  goto LAB_00174830;
LAB_00174968:
  this_01 = this_01 + 1;
  uVar9 = uVar9 + 1;
  if (this_01 == local_38) {
    return;
  }
  goto LAB_00174826;
}

Assistant:

void xr_mesh_builder::create_edges(bool calc_smoothness)
{
	m_vertex_edges.assign(m_points.size(), BAD_IDX);
	m_edges.clear();
	m_edges.reserve(m_points.size());
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t i = 3, v0, v1 = it->v0; i != 0; v1 = v0) {
			b_edge* edge = find_edge(v0 = it->v[--i], v1);
			if (edge == 0) {
				it->link[i] = BAD_IDX;
				uint32_t next = m_vertex_edges[v0];
				m_vertex_edges[v0] = uint32_t(m_edges.size() & UINT32_MAX);
				m_edges.push_back(b_edge(v1, face_idx, next));
			} else {
				it->link[i] = edge->face0;
				if (!calc_smoothness) {
					++edge->size;
				} else {
					edge->smooth = (++edge->size == 2) ?
							it->is_edge_smooth(m_faces[edge->face0], v0, v1) : false;
				}
				edge->face0 = face_idx;
			}
		}
	}
}